

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::alloca_destructor<const_libtorrent::aux::piece_picker::downloading_piece_*>::
~alloca_destructor(alloca_destructor<const_libtorrent::aux::piece_picker::downloading_piece_*> *this
                  )

{
  index_type iVar1;
  downloading_piece **ppdVar2;
  downloading_piece **o;
  downloading_piece **__end0;
  downloading_piece **__begin0;
  span<const_libtorrent::aux::piece_picker::downloading_piece_*> *__range4;
  alloca_destructor<const_libtorrent::aux::piece_picker::downloading_piece_*> *this_local;
  
  iVar1 = span<const_libtorrent::aux::piece_picker::downloading_piece_*>::size(&this->objects);
  if (iVar1 < 0x201) {
    __end0 = span<const_libtorrent::aux::piece_picker::downloading_piece_*>::begin(&this->objects);
    ppdVar2 = span<const_libtorrent::aux::piece_picker::downloading_piece_*>::end(&this->objects);
    for (; __end0 != ppdVar2; __end0 = __end0 + 1) {
    }
  }
  else {
    ppdVar2 = span<const_libtorrent::aux::piece_picker::downloading_piece_*>::data(&this->objects);
    if (ppdVar2 != (downloading_piece **)0x0) {
      operator_delete__(ppdVar2);
    }
  }
  return;
}

Assistant:

~alloca_destructor()
	{
		if (objects.size() > cutoff)
		{
			delete [] objects.data();
		}
		else
		{
			for (auto& o : objects)
			{
				TORRENT_UNUSED(o);
				o.~T();
			}
		}
	}